

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O1

void Ssc_GiaRandomPiPattern(Gia_Man_t *p,int nWords,Vec_Int_t *vPivot)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  
  Ssc_GiaResetPiPattern(p,nWords);
  if (p->vSimsPi->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  if (p->nRegs < p->vCis->nSize) {
    puVar5 = p->vSimsPi->pArray;
    lVar6 = 0;
    do {
      if (vPivot == (Vec_Int_t *)0x0) {
        uVar2 = Gia_ManRandom(0);
        uVar3 = Gia_ManRandom(0);
        uVar4 = (ulong)uVar3 << 2 | (ulong)uVar2 << 0x20 | 2;
      }
      else {
        if (vPivot->nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = vPivot->pArray[lVar6];
        uVar2 = Gia_ManRandom(0);
        uVar3 = Gia_ManRandom(0);
        uVar4 = (ulong)uVar3 * 2 | (ulong)uVar2 << 0x20 | (long)iVar1;
      }
      *puVar5 = uVar4;
      if (1 < nWords) {
        uVar4 = 1;
        do {
          uVar2 = Gia_ManRandom(0);
          uVar3 = Gia_ManRandom(0);
          puVar5[uVar4] = CONCAT44(uVar2,uVar3);
          uVar4 = uVar4 + 1;
        } while ((uint)nWords != uVar4);
      }
      lVar6 = lVar6 + 1;
      puVar5 = puVar5 + nWords;
    } while (lVar6 < (long)p->vCis->nSize - (long)p->nRegs);
  }
  return;
}

Assistant:

void Ssc_GiaRandomPiPattern( Gia_Man_t * p, int nWords, Vec_Int_t * vPivot )
{
    word * pSimPi;
    int i, w;
    Ssc_GiaResetPiPattern( p, nWords );
    pSimPi = Gia_ObjSimPi( p, 0 );
    for ( i = 0; i < Gia_ManPiNum(p); i++, pSimPi += nWords )
    {
        pSimPi[0] = vPivot ? Ssc_Random1(Vec_IntEntry(vPivot, i)) : Ssc_Random2();
        for ( w = 1; w < nWords; w++ )
            pSimPi[w] = Ssc_Random();
//        if ( i < 10 )
//            Extra_PrintBinary( stdout, (unsigned *)pSimPi, 64 ), printf( "\n" );
    }
}